

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
::matches(Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
          *this,candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>_>
                *candidate)

{
  matched_t<wasm::Match::Internal::AnyKind<bool>_> *pmVar1;
  int32_t iVar2;
  Literal local_b0;
  Literal local_98;
  Literal local_80;
  Literal local_68;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  long local_40;
  undefined1 auStack_38 [8];
  matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>_> casted;
  
  auStack_38 = (undefined1  [8])0x0;
  casted.field_0.i64 = 0;
  casted.field_0.func.super_IString.str._M_str = (char *)0x0;
  Literal::Literal(&local_98,candidate);
  Literal::operator=((Literal *)auStack_38,&local_98);
  Literal::~Literal(&local_98);
  if (this->binder != (Literal *)0x0) {
    Literal::operator=(this->binder,(Literal *)auStack_38);
  }
  Literal::Literal(&local_80,(Literal *)auStack_38);
  Literal::Literal((Literal *)&local_50.func,&local_80);
  Literal::~Literal((Literal *)&local_50.func);
  if ((uint)local_50.func.super_IString.str._M_len._0_4_ < 2 && local_40 == 2) {
    Literal::Literal(&local_68,(Literal *)auStack_38);
    Literal::Literal((Literal *)&local_50.func,&local_68);
    iVar2 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0>::
            operator()((GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0>
                        *)((long)&casted.type.id + 7),(Literal *)&local_50.func);
    pmVar1 = (this->submatchers).curr.binder;
    if (pmVar1 != (matched_t<wasm::Match::Internal::AnyKind<bool>_> *)0x0) {
      *pmVar1 = iVar2 != 0;
    }
    Literal::Literal(&local_b0,&local_68);
    Literal::~Literal(&local_b0);
    Literal::~Literal((Literal *)&local_50.func);
    Literal::~Literal(&local_68);
  }
  Literal::~Literal(&local_80);
  Literal::~Literal((Literal *)auStack_38);
  return (uint)local_50.func.super_IString.str._M_len._0_4_ < 2 && local_40 == 2;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }